

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

void * rar_read_ahead(archive_read *a,size_t min,ssize_t *avail)

{
  int iVar1;
  long *in_RDX;
  archive_read *in_RSI;
  long in_RDI;
  int ret;
  void *h;
  rar *rar;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  archive_read *in_stack_ffffffffffffffd0;
  uint *avail_00;
  void *local_8;
  
  avail_00 = (uint *)**(undefined8 **)(in_RDI + 0x948);
  local_8 = __archive_read_ahead
                      (in_stack_ffffffffffffffd0,
                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (ssize_t *)0x14963b);
  if (in_RDX != (long *)0x0) {
    if ((*(char *)(in_RDI + 0xb0) != '\0') && (*(long *)(in_RDI + 0xb8) < *in_RDX)) {
      *in_RDX = *(long *)(in_RDI + 0xb8);
    }
    if (*(long *)(avail_00 + 0x28) < *in_RDX) {
      *in_RDX = *(long *)(avail_00 + 0x28);
    }
    if (*in_RDX < 0) {
      local_8 = (void *)0x0;
    }
    else if (((*in_RDX == 0) && ((*avail_00 & 1) != 0)) && ((avail_00[6] & 2) != 0)) {
      iVar1 = archive_read_format_rar_read_header((archive_read *)avail,(archive_entry *)rar);
      if (iVar1 == 1) {
        *(undefined1 *)(avail_00 + 0x3d) = 1;
        iVar1 = archive_read_format_rar_read_header((archive_read *)avail,(archive_entry *)rar);
      }
      if (iVar1 == 0) {
        local_8 = rar_read_ahead(in_RSI,(size_t)in_RDX,(ssize_t *)avail_00);
      }
      else {
        local_8 = (void *)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

static const void *
rar_read_ahead(struct archive_read *a, size_t min, ssize_t *avail)
{
  struct rar *rar = (struct rar *)(a->format->data);
  const void *h = __archive_read_ahead(a, min, avail);
  int ret;
  if (avail)
  {
    if (a->read_data_is_posix_read && *avail > (ssize_t)a->read_data_requested)
      *avail = a->read_data_requested;
    if (*avail > rar->bytes_remaining)
      *avail = (ssize_t)rar->bytes_remaining;
    if (*avail < 0)
      return NULL;
    else if (*avail == 0 && rar->main_flags & MHD_VOLUME &&
      rar->file_flags & FHD_SPLIT_AFTER)
    {
      ret = archive_read_format_rar_read_header(a, a->entry);
      if (ret == (ARCHIVE_EOF))
      {
        rar->has_endarc_header = 1;
        ret = archive_read_format_rar_read_header(a, a->entry);
      }
      if (ret != (ARCHIVE_OK))
        return NULL;
      return rar_read_ahead(a, min, avail);
    }
  }
  return h;
}